

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cram_io.c
# Opt level: O0

int cram_seek(cram_fd *fd,off_t offset,int whence)

{
  off_t oVar1;
  ssize_t sVar2;
  int iStack_10038;
  undefined1 auStack_10028 [4];
  int len;
  char buf [65536];
  off_t oStack_20;
  int whence_local;
  off_t offset_local;
  cram_fd *fd_local;
  
  fd->ooc = 0;
  oVar1 = hseek(fd->fp,offset,whence);
  if (oVar1 < 0) {
    if ((whence == 1) && (oStack_20 = offset, -1 < offset)) {
      for (; 0 < oStack_20; oStack_20 = oStack_20 - iStack_10038) {
        if (oStack_20 < 0x10001) {
          iStack_10038 = (int)oStack_20;
        }
        else {
          iStack_10038 = 0x10000;
        }
        sVar2 = hread(fd->fp,auStack_10028,(long)iStack_10038);
        if (iStack_10038 != sVar2) {
          return -1;
        }
      }
      fd_local._4_4_ = 0;
    }
    else {
      fd_local._4_4_ = -1;
    }
  }
  else {
    fd_local._4_4_ = 0;
  }
  return fd_local._4_4_;
}

Assistant:

int cram_seek(cram_fd *fd, off_t offset, int whence) {
    char buf[65536];

    fd->ooc = 0;

    if (hseek(fd->fp, offset, whence) >= 0)
	return 0;

    if (!(whence == SEEK_CUR && offset >= 0))
	return -1;

    /* Couldn't fseek, but we're in SEEK_CUR mode so read instead */
    while (offset > 0) {
	int len = MIN(65536, offset);
	if (len != hread(fd->fp, buf, len))
	    return -1;
	offset -= len;
    }

    return 0;
}